

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O0

int GetValuePololu(POLOLU *pPololu,int channel,int *pValue)

{
  int iVar1;
  int recvbuflen;
  int sendbuflen;
  uchar recvbuf [512];
  uchar sendbuf [512];
  int *pValue_local;
  int channel_local;
  POLOLU *pPololu_local;
  
  memset(recvbuf + 0x1f8,0,0x200);
  recvbuf[0x1f8] = 0xaa;
  recvbuf[0x1f9] = (uchar)pPololu->DeviceNumber;
  recvbuf[0x1fa] = '\x10';
  recvbuf[0x1fb] = (uchar)channel;
  iVar1 = WriteAllRS232Port(&pPololu->RS232Port,recvbuf + 0x1f8,4);
  if (iVar1 == 0) {
    if ((pPololu->bSaveRawData != 0) && (pPololu->pfSaveFile != (FILE *)0x0)) {
      fwrite(recvbuf + 0x1f8,4,1,(FILE *)pPololu->pfSaveFile);
      fflush((FILE *)pPololu->pfSaveFile);
    }
    mSleep(10);
    memset(&recvbuflen,0,0x200);
    iVar1 = ReadAllRS232Port(&pPololu->RS232Port,(uint8 *)&recvbuflen,2);
    if (iVar1 == 0) {
      if ((pPololu->bSaveRawData != 0) && (pPololu->pfSaveFile != (FILE *)0x0)) {
        fwrite(&recvbuflen,2,1,(FILE *)pPololu->pfSaveFile);
        fflush((FILE *)pPololu->pfSaveFile);
      }
      *pValue = (uint)(byte)recvbuflen + (uint)recvbuflen._1_1_ * 0x100;
      pPololu_local._4_4_ = 0;
    }
    else {
      pPololu_local._4_4_ = 1;
    }
  }
  else {
    pPololu_local._4_4_ = 1;
  }
  return pPololu_local._4_4_;
}

Assistant:

inline int GetValuePololu(POLOLU* pPololu, int channel, int* pValue)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	unsigned char recvbuf[MAX_NB_BYTES_POLOLU];
	int sendbuflen = 0;
	int recvbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
	sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
	sendbuf[2] = (unsigned char)(GET_POSITION_COMMAND_POLOLU & 0x7F);
	sendbuf[3] = (unsigned char)channel;
	sendbuflen = 4;

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	mSleep(10); // Added because sometimes there was a timeout on the read() 
	// (even though the data were available if read just after the timeout...)...

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 2;

	if (ReadAllRS232Port(&pPololu->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);
	*pValue = recvbuf[0] + 256*recvbuf[1];

	return EXIT_SUCCESS;
}